

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O3

void preprocessMode(Problem *problem,bool theory)

{
  UnitList *pUVar1;
  Unit *this;
  pointer pcVar2;
  Problem *this_00;
  int iVar3;
  Formula *pFVar4;
  Unit *pUVar5;
  ostream *poVar6;
  Unit *extraout_RDX;
  Unit *unit;
  Unit *extraout_RDX_00;
  Unit *extraout_RDX_01;
  Unit *extraout_RDX_02;
  ScopedPtr<Kernel::Problem> prb;
  undefined1 local_88 [32];
  void *local_68;
  undefined8 uStack_60;
  Problem *local_50;
  Preprocess local_48;
  Problem *local_38;
  
  local_48._options = Lib::env;
  local_48._clausify = false;
  local_48._stillSimplify = false;
  if ((Lib::env->_mode).super_OptionValue<Shell::Options::Mode>.actualValue == PREPROCESS2) {
    local_48._clausify = false;
    local_48._stillSimplify = true;
  }
  local_38 = problem;
  Shell::Preprocess::preprocess(&local_48,problem);
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  pUVar1 = problem->_units;
  local_50 = problem;
  pUVar5 = extraout_RDX;
  while (pUVar1 != (UnitList *)0x0) {
    this = pUVar1->_head;
    pUVar1 = pUVar1->_tail;
    if ((((Lib::env->_showAll).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 != '\0')
        || (((Lib::env->_showFOOL).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 & 1)
            != 0)) ||
       (((undefined1  [48])this->_inference & (undefined1  [48])0xfe00) != (undefined1  [48])0xd200)
       ) {
      if (theory) {
        pFVar4 = Kernel::Unit::getFormula(this);
        if (((uint)*(ulong *)&this->_inference & 0x1c) == 8) {
          *(ulong *)&this->_inference = *(ulong *)&this->_inference | 0xc;
        }
        pUVar5 = (Unit *)operator_new(0x48,8);
        local_88._0_8_ = *(undefined8 *)&this->_inference;
        local_88._8_8_ = *(undefined8 *)&(this->_inference).field_0x8;
        local_88._16_8_ = (this->_inference)._splits;
        local_88._24_8_ = (this->_inference)._ptr1;
        local_68 = (this->_inference)._ptr2;
        uStack_60._0_4_ = (this->_inference).th_ancestors;
        uStack_60._4_4_ = (this->_inference).all_ancestors;
        Kernel::Unit::Unit(pUVar5,FORMULA,(Inference *)local_88);
        *(Formula **)(pUVar5 + 1) = pFVar4;
        *(undefined8 *)&pUVar5[1]._inference = 3;
        Kernel::Unit::doUnitTracing(pUVar5);
        Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_88,(TPTPPrinter *)pUVar5,unit);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_88._0_8_,local_88._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        pUVar5 = extraout_RDX_00;
      }
      else {
        Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_88,(TPTPPrinter *)this,pUVar5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_88._0_8_,local_88._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        pUVar5 = extraout_RDX_01;
      }
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
        pUVar5 = extraout_RDX_02;
      }
    }
  }
  pcVar2 = (Lib::env->_latexOutput).
           super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .actualValue._M_dataplus._M_p;
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar2,
             pcVar2 + (Lib::env->_latexOutput).
                      super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .actualValue._M_string_length);
  iVar3 = std::__cxx11::string::compare(local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  this_00 = local_50;
  if (iVar3 != 0) {
    outputProblemToLaTeX(local_50);
  }
  vampireReturnValue = 0;
  Kernel::Problem::~Problem(this_00);
  operator_delete(this_00,0x110);
  return;
}

Assistant:

void preprocessMode(Problem* problem, bool theory)
{
  ScopedPtr<Problem> prb(problem);

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // preprocess without clausification
  Shell::Preprocess prepro(*env.options);
  prepro.turnClausifierOff();
  if(env.options->mode() == Options::Mode::PREPROCESS2){
    prepro.keepSimplifyStep();
  }
  prepro.preprocess(*prb);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());
  while (units.hasNext()) {
    Unit* u = units.next();
    if (!env.options->showFOOL()) {
      if (u->inference().rule() == InferenceRule::FOOL_AXIOM_TRUE_NEQ_FALSE || u->inference().rule() == InferenceRule::FOOL_AXIOM_ALL_IS_TRUE_OR_FALSE) {
        continue;
      }
    }

    if (theory) {
      Formula* f = u->getFormula();

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (u->inference().inputType() == UnitInputType::CONJECTURE) {
        u->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,u->inference()); // we are stealing u's inference which is not nice
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(u) << "\n";
    }
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}